

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O2

void __thiscall
dense_parameters::set_default<polar_normal_weights_wrapper<dense_parameters>>
          (dense_parameters *this)

{
  weight *w;
  weight *pwVar1;
  uint32_t uVar2;
  weight *pwVar3;
  long lVar4;
  
  uVar2 = this->_stride_shift;
  pwVar1 = this->_begin;
  pwVar3 = pwVar1;
  for (lVar4 = 0; w = (weight *)((long)pwVar1 + lVar4), w != pwVar3 + this->_weight_mask + 1;
      lVar4 = lVar4 + (1L << ((byte)uVar2 & 0x3f)) * 4) {
    polar_normal_weights_wrapper<dense_parameters>::func(w,lVar4 >> 2);
    pwVar3 = this->_begin;
  }
  return;
}

Assistant:

void set_default()
  {
    iterator iter = begin();
    for (size_t i = 0; iter != end(); ++iter, i += stride()) T::func(*iter, iter.index());
  }